

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

void __thiscall getCommandList::test_method(getCommandList *this)

{
  bool bVar1;
  string *psVar2;
  undefined8 uVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> local_a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_98;
  basic_cstring<const_char> local_70;
  basic_cstring<const_char> local_60 [2];
  allocator<char> local_39;
  string local_38 [32];
  undefined8 local_18;
  Entity *entity;
  getCommandList *this_local;
  
  entity = (Entity *)this;
  psVar2 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"my-entity",&local_39);
  uVar3 = dynamicgraph::PoolStorage::getEntity(psVar2);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = uVar3;
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,local_60,0xb8,&local_70);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_98,prev,(char (*) [1])0x1676f7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
               ,0x61);
    uVar3 = dynamicgraph::Entity::getCommandList_abi_cxx11_();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[24]>
              (&local_98,&local_a8,0xb8,1,2,uVar3,"entity.getCommandList()",
               "print\nsignals\nsignalDep","\"print\\nsignals\\nsignalDep\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(getCommandList) {
  dynamicgraph::Entity &entity =
      dynamicgraph::PoolStorage::getInstance()->getEntity("my-entity");

  BOOST_CHECK_EQUAL(entity.getCommandList(), "print\nsignals\nsignalDep");
}